

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edition_unittest.pb.cc
# Opt level: O3

uint8_t * __thiscall
edition_unittest::TestNestedExtension_OptionalGroup_extension::_InternalSerialize
          (TestNestedExtension_OptionalGroup_extension *this,uint8_t *target,
          EpsCopyOutputStream *stream)

{
  bool bVar1;
  uint8_t *puVar2;
  byte *pbVar3;
  ulong uVar4;
  ulong uVar5;
  
  if ((undefined1  [12])((undefined1  [12])this->field_0 & (undefined1  [12])0x1) !=
      (undefined1  [12])0x0) {
    if (stream->end_ <= target) {
      target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    uVar4 = (ulong)(this->field_0)._impl_.a_;
    pbVar3 = target + 2;
    target[0] = 0x88;
    target[1] = '\x01';
    uVar5 = uVar4;
    if (0x7f < uVar4) {
      do {
        *pbVar3 = (byte)uVar5 | 0x80;
        uVar4 = uVar5 >> 7;
        pbVar3 = pbVar3 + 1;
        bVar1 = 0x3fff < uVar5;
        uVar5 = uVar4;
      } while (bVar1);
    }
    *pbVar3 = (byte)uVar4;
    target = pbVar3 + 1;
  }
  uVar5 = (this->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if ((uVar5 & 1) != 0) {
    puVar2 = google::protobuf::internal::WireFormat::InternalSerializeUnknownFieldsToArray
                       ((UnknownFieldSet *)((uVar5 & 0xfffffffffffffffe) + 8),target,stream);
    return puVar2;
  }
  return target;
}

Assistant:

::uint8_t* PROTOBUF_NONNULL TestNestedExtension_OptionalGroup_extension::_InternalSerialize(
    ::uint8_t* PROTOBUF_NONNULL target,
    ::google::protobuf::io::EpsCopyOutputStream* PROTOBUF_NONNULL stream) const {
  const TestNestedExtension_OptionalGroup_extension& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(serialize_to_array_start:edition_unittest.TestNestedExtension.OptionalGroup_extension)
  ::uint32_t cached_has_bits = 0;
  (void)cached_has_bits;

  cached_has_bits = this_._impl_._has_bits_[0];
  // int32 a = 17;
  if ((cached_has_bits & 0x00000001u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteInt32ToArray(
        17, this_._internal_a(), target);
  }

  if (ABSL_PREDICT_FALSE(this_._internal_metadata_.have_unknown_fields())) {
    target =
        ::_pbi::WireFormat::InternalSerializeUnknownFieldsToArray(
            this_._internal_metadata_.unknown_fields<::google::protobuf::UnknownFieldSet>(::google::protobuf::UnknownFieldSet::default_instance), target, stream);
  }
  // @@protoc_insertion_point(serialize_to_array_end:edition_unittest.TestNestedExtension.OptionalGroup_extension)
  return target;
}